

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

void fs_event_cb_close(uv_fs_event_t *handle,char *filename,int events,int status)

{
  size_t sVar1;
  int iVar2;
  uv_loop_t *puVar3;
  uv_loop_t *loop;
  int extraout_EDX;
  long lVar4;
  char *pcVar5;
  uv_fs_event_t *puVar6;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_6c8 [16];
  uv__queue uStack_6b8;
  uv__queue *puStack_6a8;
  uv_timer_t uStack_6a0;
  uv_fs_event_t uStack_628;
  uv_loop_t *puStack_5c0;
  uv_fs_event_t *puStack_5b8;
  long lStack_5b0;
  long lStack_5a8;
  uv_loop_t *puStack_5a0;
  long lStack_598;
  long lStack_590;
  uv_loop_t *puStack_588;
  size_t sStack_578;
  size_t sStack_570;
  size_t sStack_568;
  char acStack_560 [1032];
  uv_loop_t *puStack_158;
  undefined1 auStack_108 [16];
  uv_fs_event_t uStack_f8;
  uv_fs_event_t uStack_90;
  
  if (status == 0) {
    status = fs_event_cb_called;
    if (fs_event_cb_called < 3) {
      fs_event_cb_called = fs_event_cb_called + 1;
      if (fs_event_cb_called == 3) {
        uv_close((uv_handle_t *)handle,close_cb);
        return;
      }
      return;
    }
  }
  else {
    fs_event_cb_close_cold_1();
  }
  fs_event_cb_close_cold_2();
  puVar3 = uv_default_loop();
  create_dir("watch_dir");
  iVar2 = uv_fs_event_init(puVar3,&uStack_90);
  uStack_f8.data = (void *)(long)iVar2;
  auStack_108._0_8_ = (uv_loop_t *)0x0;
  if (uStack_f8.data == (void *)0x0) {
    status = 0;
    iVar2 = uv_fs_event_start(&uStack_90,fs_event_cb_dir,"watch_dir",0);
    uStack_f8.data = (void *)(long)iVar2;
    auStack_108._0_8_ = (uv_loop_t *)0x0;
    if (uStack_f8.data != (void *)0x0) goto LAB_00185f70;
    iVar2 = uv_fs_event_init(puVar3,&uStack_f8);
    auStack_108._0_8_ = SEXT48(iVar2);
    auStack_108._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_108._0_8_ != (uv_loop_t *)0x0) goto LAB_00185f7f;
    status = 0;
    iVar2 = uv_fs_event_start(&uStack_f8,fs_event_cb_dir,"watch_dir",0);
    auStack_108._0_8_ = SEXT48(iVar2);
    auStack_108._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_108._0_8_ != (uv_loop_t *)0x0) goto LAB_00185f8e;
    uv_close((uv_handle_t *)&uStack_f8,close_cb);
    uv_close((uv_handle_t *)&uStack_90,close_cb);
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_108._0_8_ = (uv_loop_t *)0x2;
    auStack_108._8_8_ = SEXT48(close_cb_called);
    if ((uv_loop_t *)auStack_108._8_8_ != (uv_loop_t *)0x2) goto LAB_00185f9d;
    remove("watch_dir/");
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_108._0_8_ = (uv_loop_t *)0x0;
    iVar2 = uv_loop_close(puVar3);
    auStack_108._8_8_ = SEXT48(iVar2);
    if (auStack_108._0_8_ == auStack_108._8_8_) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_fs_event_start_and_close_cold_1();
LAB_00185f70:
    run_test_fs_event_start_and_close_cold_2();
LAB_00185f7f:
    run_test_fs_event_start_and_close_cold_3();
LAB_00185f8e:
    run_test_fs_event_start_and_close_cold_4();
LAB_00185f9d:
    run_test_fs_event_start_and_close_cold_5();
  }
  puVar6 = (uv_fs_event_t *)auStack_108;
  pcVar5 = auStack_108 + 8;
  run_test_fs_event_start_and_close_cold_6();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar6 == &fs_event) {
    if (status != 0) goto LAB_00186089;
    if (extraout_EDX != 2) goto LAB_00186098;
    iVar2 = strcmp(pcVar5,"file1");
    if (iVar2 != 0) goto LAB_001860a7;
    iVar2 = uv_fs_event_stop(&fs_event);
    if (iVar2 == 0) {
      uv_close((uv_handle_t *)&fs_event,close_cb);
      return;
    }
  }
  else {
    fs_event_cb_dir_cold_1();
LAB_00186089:
    fs_event_cb_dir_cold_2();
LAB_00186098:
    fs_event_cb_dir_cold_3();
LAB_001860a7:
    fs_event_cb_dir_cold_4();
  }
  fs_event_cb_dir_cold_5();
  puStack_588 = (uv_loop_t *)0x1860db;
  puStack_158 = puVar3;
  puVar3 = uv_default_loop();
  puStack_588 = (uv_loop_t *)0x1860ea;
  create_dir("watch_dir");
  puStack_588 = (uv_loop_t *)0x1860f6;
  create_dir("watch_dir/subfolder");
  lVar4 = 0;
  sVar1 = sStack_578;
  do {
    sStack_578 = sVar1;
    puStack_588 = (uv_loop_t *)0x186114;
    iVar2 = uv_fs_event_init(puVar3,&fs_event);
    sStack_570 = (size_t)iVar2;
    sStack_578 = 0;
    if (sStack_570 != 0) {
LAB_00186404:
      puStack_588 = (uv_loop_t *)0x186413;
      run_test_fs_event_getpath_cold_1();
      goto LAB_00186413;
    }
    sStack_568 = 0x400;
    puStack_588 = (uv_loop_t *)0x18614b;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_560,&sStack_568);
    sStack_570 = (size_t)iVar2;
    sStack_578 = 0xffffffffffffffea;
    if (sStack_570 != 0xffffffffffffffea) {
LAB_001863f5:
      puStack_588 = (uv_loop_t *)0x186404;
      run_test_fs_event_getpath_cold_2();
      goto LAB_00186404;
    }
    pcVar5 = *(char **)((long)&DAT_00268bc0 + lVar4);
    puStack_588 = (uv_loop_t *)0x18618b;
    iVar2 = uv_fs_event_start(&fs_event,fail_cb,pcVar5,0);
    sStack_570 = (size_t)iVar2;
    sStack_578 = 0;
    if (sStack_570 != 0) {
LAB_001863e6:
      puStack_588 = (uv_loop_t *)0x1863f5;
      run_test_fs_event_getpath_cold_3();
      goto LAB_001863f5;
    }
    sStack_568 = 0;
    puStack_588 = (uv_loop_t *)0x1861c2;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_560,&sStack_568);
    sStack_570 = (size_t)iVar2;
    sStack_578 = 0xffffffffffffff97;
    if (sStack_570 != 0xffffffffffffff97) {
LAB_001863d7:
      puStack_588 = (uv_loop_t *)0x1863e6;
      run_test_fs_event_getpath_cold_4();
      goto LAB_001863e6;
    }
    sStack_570 = sStack_568;
    sStack_578 = 0x400;
    if (0x3ff < (long)sStack_568) {
LAB_001863c8:
      puStack_588 = (uv_loop_t *)0x1863d7;
      run_test_fs_event_getpath_cold_5();
      goto LAB_001863d7;
    }
    puStack_588 = (uv_loop_t *)0x186212;
    sStack_578 = strlen(pcVar5);
    sStack_578 = sStack_578 + 1;
    if (sStack_570 != sStack_578) {
LAB_001863b9:
      puStack_588 = (uv_loop_t *)0x1863c8;
      run_test_fs_event_getpath_cold_6();
      goto LAB_001863c8;
    }
    puStack_588 = (uv_loop_t *)0x186238;
    iVar2 = uv_fs_event_getpath(&fs_event,acStack_560,&sStack_568);
    sStack_570 = (size_t)iVar2;
    sStack_578 = 0;
    if (sStack_570 != 0) {
LAB_001863aa:
      puStack_588 = (uv_loop_t *)0x1863b9;
      run_test_fs_event_getpath_cold_7();
      goto LAB_001863b9;
    }
    sStack_570 = sStack_568;
    puStack_588 = (uv_loop_t *)0x18626a;
    sStack_578 = strlen(pcVar5);
    if (sStack_570 != sStack_578) {
LAB_0018639b:
      puStack_588 = (uv_loop_t *)0x1863aa;
      run_test_fs_event_getpath_cold_8();
      goto LAB_001863aa;
    }
    puStack_588 = (uv_loop_t *)0x18628a;
    iVar2 = strcmp(acStack_560,pcVar5);
    if (iVar2 != 0) {
LAB_00186396:
      puStack_588 = (uv_loop_t *)0x18639b;
      run_test_fs_event_getpath_cold_9();
      goto LAB_0018639b;
    }
    puStack_588 = (uv_loop_t *)0x18629a;
    iVar2 = uv_fs_event_stop(&fs_event);
    sStack_570 = (size_t)iVar2;
    sStack_578 = 0;
    if (sStack_570 != 0) {
LAB_00186387:
      puStack_588 = (uv_loop_t *)0x186396;
      run_test_fs_event_getpath_cold_10();
      goto LAB_00186396;
    }
    puStack_588 = (uv_loop_t *)0x1862c9;
    uv_close((uv_handle_t *)&fs_event,close_cb);
    puStack_588 = (uv_loop_t *)0x1862d3;
    uv_run(puVar3,UV_RUN_DEFAULT);
    sStack_570 = 1;
    sStack_578 = (size_t)close_cb_called;
    if (sStack_578 != 1) {
      puStack_588 = (uv_loop_t *)0x186387;
      run_test_fs_event_getpath_cold_11();
      goto LAB_00186387;
    }
    close_cb_called = 0;
    lVar4 = lVar4 + 8;
    sVar1 = 1;
  } while (lVar4 != 0x28);
  puStack_588 = (uv_loop_t *)0x18631c;
  remove("watch_dir/");
  puStack_588 = (uv_loop_t *)0x18632d;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_588 = (uv_loop_t *)0x186337;
  uv_run(puVar3,UV_RUN_DEFAULT);
  sStack_570 = 0;
  puStack_588 = (uv_loop_t *)0x186348;
  iVar2 = uv_loop_close(puVar3);
  sStack_578 = (size_t)iVar2;
  if (sStack_570 == sStack_578) {
    puStack_588 = (uv_loop_t *)0x186364;
    uv_library_shutdown();
    return;
  }
LAB_00186413:
  puStack_588 = (uv_loop_t *)run_test_fs_event_error_reporting;
  run_test_fs_event_getpath_cold_12();
  puStack_5a0 = (uv_loop_t *)0x18642c;
  puStack_588 = puVar3;
  puVar3 = uv_default_loop();
  puStack_5a0 = (uv_loop_t *)0x186440;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_5a0 = (uv_loop_t *)0x18644a;
  uv_run(puVar3,UV_RUN_DEFAULT);
  lStack_590 = 0;
  puStack_5a0 = (uv_loop_t *)0x186458;
  loop = uv_default_loop();
  puStack_5a0 = (uv_loop_t *)0x186460;
  iVar2 = uv_loop_close(loop);
  lStack_598 = (long)iVar2;
  if (lStack_590 == lStack_598) {
    puStack_5a0 = (uv_loop_t *)0x186476;
    uv_library_shutdown();
    return;
  }
  puStack_5a0 = (uv_loop_t *)run_test_fs_event_watch_invalid_path;
  run_test_fs_event_error_reporting_cold_1();
  puStack_5b8 = (uv_fs_event_t *)0x186495;
  puStack_5a0 = puVar3;
  puVar3 = uv_default_loop();
  puStack_5b8 = (uv_fs_event_t *)0x1864a7;
  iVar2 = uv_fs_event_init(puVar3,&fs_event);
  lStack_5a8 = (long)iVar2;
  lStack_5b0 = 0;
  if (lStack_5a8 == 0) {
    puStack_5b8 = (uv_fs_event_t *)0x1864e1;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"<:;",0);
    if (iVar2 == 0) goto LAB_001865b4;
    puStack_5b8 = (uv_fs_event_t *)0x1864f5;
    iVar2 = uv_is_active((uv_handle_t *)&fs_event);
    lStack_5a8 = (long)iVar2;
    lStack_5b0 = 0;
    if (lStack_5a8 != 0) goto LAB_001865b9;
    puStack_5b8 = (uv_fs_event_t *)0x18652f;
    iVar2 = uv_fs_event_start(&fs_event,fs_event_cb_file,"",0);
    if (iVar2 == 0) goto LAB_001865c6;
    puStack_5b8 = (uv_fs_event_t *)0x186543;
    iVar2 = uv_is_active((uv_handle_t *)&fs_event);
    lStack_5a8 = (long)iVar2;
    lStack_5b0 = 0;
    if (lStack_5a8 != 0) goto LAB_001865cb;
    puStack_5b8 = (uv_fs_event_t *)0x18656e;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    puStack_5b8 = (uv_fs_event_t *)0x186578;
    uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_5a8 = 0;
    puStack_5b8 = (uv_fs_event_t *)0x186589;
    iVar2 = uv_loop_close(puVar3);
    lStack_5b0 = (long)iVar2;
    if (lStack_5a8 == lStack_5b0) {
      puStack_5b8 = (uv_fs_event_t *)0x18659f;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_5b8 = (uv_fs_event_t *)0x1865b4;
    run_test_fs_event_watch_invalid_path_cold_1();
LAB_001865b4:
    puStack_5b8 = (uv_fs_event_t *)0x1865b9;
    run_test_fs_event_watch_invalid_path_cold_6();
LAB_001865b9:
    puStack_5b8 = (uv_fs_event_t *)0x1865c6;
    run_test_fs_event_watch_invalid_path_cold_2();
LAB_001865c6:
    puStack_5b8 = (uv_fs_event_t *)0x1865cb;
    run_test_fs_event_watch_invalid_path_cold_5();
LAB_001865cb:
    puStack_5b8 = (uv_fs_event_t *)0x1865d8;
    run_test_fs_event_watch_invalid_path_cold_3();
  }
  puStack_5b8 = (uv_fs_event_t *)run_test_fs_event_stop_in_cb;
  run_test_fs_event_watch_invalid_path_cold_4();
  puStack_5b8 = &fs_event;
  puVar6 = (uv_fs_event_t *)auStack_6c8;
  uStack_6b8.next = (uv__queue *)0x746e6576655f7366;
  uStack_6b8.prev = (uv__queue *)0x6e695f706f74735f;
  puStack_6a8 = (uv__queue *)0x7478742e62635f;
  puStack_5c0 = puVar3;
  remove((char *)&uStack_6b8);
  create_file((char *)&uStack_6b8);
  puVar3 = uv_default_loop();
  iVar2 = uv_fs_event_init(puVar3,&uStack_628);
  uStack_6a0.data = (void *)(long)iVar2;
  auStack_6c8._0_8_ = (uv_loop_t *)0x0;
  if ((uv__queue *)uStack_6a0.data == (uv__queue *)0x0) {
    iVar2 = uv_fs_event_start(&uStack_628,fs_event_cb_stop,(char *)&uStack_6b8,0);
    uStack_6a0.data = (void *)(long)iVar2;
    auStack_6c8._0_8_ = (uv_loop_t *)0x0;
    if ((uv__queue *)uStack_6a0.data != (uv__queue *)0x0) goto LAB_00186886;
    uStack_6a0.data = &uStack_6b8;
    puVar3 = uv_default_loop();
    iVar2 = uv_timer_init(puVar3,&uStack_6a0);
    auStack_6c8._0_8_ = SEXT48(iVar2);
    auStack_6c8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_6c8._0_8_ != (uv_loop_t *)0x0) goto LAB_00186893;
    iVar2 = uv_timer_start(&uStack_6a0,timer_cb_touch,100,0);
    auStack_6c8._0_8_ = SEXT48(iVar2);
    auStack_6c8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_6c8._0_8_ != (uv_loop_t *)0x0) goto LAB_001868a0;
    auStack_6c8._0_8_ = SEXT48(fs_event_cb_stop_calls);
    auStack_6c8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_6c8._0_8_ != (uv_loop_t *)0x0) goto LAB_001868ad;
    auStack_6c8._0_8_ = SEXT48(timer_cb_touch_called);
    auStack_6c8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_6c8._0_8_ != (uv_loop_t *)0x0) goto LAB_001868ba;
    puVar3 = uv_default_loop();
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_6c8._0_8_ = SEXT48(iVar2);
    auStack_6c8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_6c8._0_8_ != (uv_loop_t *)0x0) goto LAB_001868c7;
    auStack_6c8._0_8_ = (uv_loop_t *)0x1;
    auStack_6c8._8_8_ = SEXT48(fs_event_cb_stop_calls);
    if ((uv_loop_t *)auStack_6c8._8_8_ != (uv_loop_t *)0x1) goto LAB_001868d4;
    auStack_6c8._0_8_ = (uv_loop_t *)0x1;
    auStack_6c8._8_8_ = SEXT48(timer_cb_touch_called);
    if ((uv_loop_t *)auStack_6c8._8_8_ != (uv_loop_t *)0x1) goto LAB_001868e1;
    uv_close((uv_handle_t *)&uStack_628,(uv_close_cb)0x0);
    puVar3 = uv_default_loop();
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_6c8._0_8_ = SEXT48(iVar2);
    auStack_6c8._8_8_ = (uv_loop_t *)0x0;
    if ((uv_loop_t *)auStack_6c8._0_8_ != (uv_loop_t *)0x0) goto LAB_001868ee;
    auStack_6c8._0_8_ = (uv_loop_t *)0x1;
    auStack_6c8._8_8_ = SEXT48(fs_event_cb_stop_calls);
    if ((uv_loop_t *)auStack_6c8._8_8_ == (uv_loop_t *)0x1) {
      remove((char *)&uStack_6b8);
      puVar3 = uv_default_loop();
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      auStack_6c8._0_8_ = (uv_loop_t *)0x0;
      puVar3 = uv_default_loop();
      iVar2 = uv_loop_close(puVar3);
      auStack_6c8._8_8_ = SEXT48(iVar2);
      if (auStack_6c8._0_8_ == auStack_6c8._8_8_) {
        uv_library_shutdown();
        return;
      }
      goto LAB_00186908;
    }
  }
  else {
    run_test_fs_event_stop_in_cb_cold_1();
LAB_00186886:
    run_test_fs_event_stop_in_cb_cold_2();
LAB_00186893:
    run_test_fs_event_stop_in_cb_cold_3();
LAB_001868a0:
    run_test_fs_event_stop_in_cb_cold_4();
LAB_001868ad:
    run_test_fs_event_stop_in_cb_cold_5();
LAB_001868ba:
    run_test_fs_event_stop_in_cb_cold_6();
LAB_001868c7:
    run_test_fs_event_stop_in_cb_cold_7();
LAB_001868d4:
    run_test_fs_event_stop_in_cb_cold_8();
LAB_001868e1:
    run_test_fs_event_stop_in_cb_cold_9();
LAB_001868ee:
    run_test_fs_event_stop_in_cb_cold_10();
  }
  run_test_fs_event_stop_in_cb_cold_11();
LAB_00186908:
  run_test_fs_event_stop_in_cb_cold_12();
  uv_fs_event_stop(puVar6);
  fs_event_cb_stop_calls = fs_event_cb_stop_calls + 1;
  return;
}

Assistant:

static void fs_event_cb_close(uv_fs_event_t* handle,
                              const char* filename,
                              int events,
                              int status) {
  ASSERT_OK(status);

  ASSERT_LT(fs_event_cb_called, 3);
  ++fs_event_cb_called;

  if (fs_event_cb_called == 3) {
    uv_close((uv_handle_t*) handle, close_cb);
  }
}